

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_transaction_manager.cpp
# Opt level: O2

void __thiscall
duckdb::DuckTransactionManager::Checkpoint
          (DuckTransactionManager *this,ClientContext *context,bool force)

{
  _Alloc_hider _Var1;
  bool bVar2;
  StorageManager *this_00;
  DuckTransaction *this_01;
  InterruptException *this_02;
  TransactionException *pTVar3;
  unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true> lock;
  allocator local_61;
  string local_60;
  pthread_mutex_t *local_40;
  optional_ptr<duckdb::Transaction,_true> current;
  
  this_00 = AttachedDatabase::GetStorageManager((this->super_TransactionManager).db);
  bVar2 = StorageManager::InMemory(this_00);
  if (bVar2) {
    return;
  }
  current = Transaction::TryGet(context,(this->super_TransactionManager).db);
  if (current.ptr == (Transaction *)0x0) {
    lock.super_unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>._M_t
    .super___uniq_ptr_impl<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::StorageLockKey_*,_std::default_delete<duckdb::StorageLockKey>_>.
    super__Head_base<0UL,_duckdb::StorageLockKey_*,_false>._M_head_impl =
         (unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>)
         (__uniq_ptr_data<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true,_true>
          )0x0;
    if (force) {
      local_40 = (pthread_mutex_t *)&this->start_transaction_lock;
      ::std::mutex::lock((mutex *)&local_40->__data);
      while (lock.
             super_unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>.
             _M_t.
             super___uniq_ptr_impl<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::StorageLockKey_*,_std::default_delete<duckdb::StorageLockKey>_>
             .super__Head_base<0UL,_duckdb::StorageLockKey_*,_false>._M_head_impl ==
             (__uniq_ptr_data<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true,_true>
              )0x0) {
        if (((context->interrupted)._M_base._M_i & 1U) != 0) {
          this_02 = (InterruptException *)__cxa_allocate_exception(0x10);
          InterruptException::InterruptException(this_02);
          __cxa_throw(this_02,&InterruptException::typeinfo,::std::runtime_error::~runtime_error);
        }
        StorageLock::TryGetExclusiveLock((StorageLock *)&local_60);
        _Var1._M_p = local_60._M_dataplus._M_p;
        local_60._M_dataplus._M_p = (pointer)0x0;
        ::std::__uniq_ptr_impl<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>
        ::reset((__uniq_ptr_impl<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>
                 *)&lock,(pointer)_Var1._M_p);
        ::std::unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>::
        ~unique_ptr((unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>
                     *)&local_60);
      }
      pthread_mutex_unlock(local_40);
      goto LAB_0057ebb8;
    }
  }
  else {
    if (force) {
      pTVar3 = (TransactionException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_60,
                 "Cannot FORCE CHECKPOINT: the current transaction has been started for this database"
                 ,(allocator *)&lock);
      TransactionException::TransactionException(pTVar3,&local_60);
      __cxa_throw(pTVar3,&TransactionException::typeinfo,::std::runtime_error::~runtime_error);
    }
    this_01 = (DuckTransaction *)optional_ptr<duckdb::Transaction,_true>::operator->(&current);
    bVar2 = DuckTransaction::ChangesMade(this_01);
    if (bVar2) {
      pTVar3 = (TransactionException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_60,
                 "Cannot CHECKPOINT: the current transaction has transaction local changes",
                 (allocator *)&lock);
      TransactionException::TransactionException(pTVar3,&local_60);
      __cxa_throw(pTVar3,&TransactionException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  lock.super_unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>._M_t.
  super___uniq_ptr_impl<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::StorageLockKey_*,_std::default_delete<duckdb::StorageLockKey>_>.
  super__Head_base<0UL,_duckdb::StorageLockKey_*,_false>._M_head_impl =
       (unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>)
       (__uniq_ptr_data<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true,_true>
        )0x0;
  StorageLock::TryGetExclusiveLock((StorageLock *)&local_60);
  _Var1._M_p = local_60._M_dataplus._M_p;
  local_60._M_dataplus._M_p = (pointer)0x0;
  ::std::__uniq_ptr_impl<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>::
  reset((__uniq_ptr_impl<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_> *)
        &lock,(pointer)_Var1._M_p);
  ::std::unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>::
  ~unique_ptr((unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_> *)
              &local_60);
  if (lock.super_unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::StorageLockKey_*,_std::default_delete<duckdb::StorageLockKey>_>
      .super__Head_base<0UL,_duckdb::StorageLockKey_*,_false>._M_head_impl ==
      (__uniq_ptr_data<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true,_true>
       )0x0) {
    pTVar3 = (TransactionException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_60,
               "Cannot CHECKPOINT: there are other write transactions active. Try using FORCE CHECKPOINT to wait until all active transactions are finished"
               ,&local_61);
    TransactionException::TransactionException(pTVar3,&local_60);
    __cxa_throw(pTVar3,&TransactionException::typeinfo,::std::runtime_error::~runtime_error);
  }
LAB_0057ebb8:
  (*this_00->_vptr_StorageManager[5])
            (this_00,context,1,
             (ulong)((this->lowest_active_start).super___atomic_base<unsigned_long>._M_i <
                    (this->last_commit).super___atomic_base<unsigned_long>._M_i));
  ::std::unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>::
  ~unique_ptr(&lock.
               super_unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>
             );
  return;
}

Assistant:

void DuckTransactionManager::Checkpoint(ClientContext &context, bool force) {
	auto &storage_manager = db.GetStorageManager();
	if (storage_manager.InMemory()) {
		return;
	}

	auto current = Transaction::TryGet(context, db);
	if (current) {
		if (force) {
			throw TransactionException(
			    "Cannot FORCE CHECKPOINT: the current transaction has been started for this database");
		} else {
			auto &duck_transaction = current->Cast<DuckTransaction>();
			if (duck_transaction.ChangesMade()) {
				throw TransactionException("Cannot CHECKPOINT: the current transaction has transaction local changes");
			}
		}
	}

	unique_ptr<StorageLockKey> lock;
	if (!force) {
		// not a force checkpoint
		// try to get the checkpoint lock
		lock = checkpoint_lock.TryGetExclusiveLock();
		if (!lock) {
			// we could not manage to get the lock - cancel
			throw TransactionException("Cannot CHECKPOINT: there are other write transactions active. Try using FORCE "
			                           "CHECKPOINT to wait until all active transactions are finished");
		}

	} else {
		// force checkpoint - wait to get an exclusive lock
		// grab the start_transaction_lock to prevent new transactions from starting
		lock_guard<mutex> start_lock(start_transaction_lock);
		// wait until any active transactions are finished
		while (!lock) {
			if (context.interrupted) {
				throw InterruptException();
			}
			lock = checkpoint_lock.TryGetExclusiveLock();
		}
	}
	CheckpointOptions options;
	if (GetLastCommit() > LowestActiveStart()) {
		// we cannot do a full checkpoint if any transaction needs to read old data
		options.type = CheckpointType::CONCURRENT_CHECKPOINT;
	}
	storage_manager.CreateCheckpoint(context, options);
}